

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

void __thiscall Assimp::ObjFileParser::getFace(ObjFileParser *this,aiPrimitiveType type)

{
  bool bVar1;
  reference pcVar2;
  Face *pFVar3;
  pointer pMVar4;
  size_type sVar5;
  DeadlyImportError *this_00;
  Logger *pLVar6;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> _Var7;
  allocator local_a1;
  string local_a0;
  value_type_conflict4 local_80;
  value_type_conflict4 local_7c;
  value_type_conflict4 local_78;
  value_type_conflict4 local_74;
  value_type_conflict4 local_70;
  value_type_conflict4 local_6c;
  int local_68;
  int local_64;
  int tmp;
  int iVal;
  int iPos;
  int iStep;
  bool vn;
  int iStack_50;
  bool vt;
  int vnSize;
  int vtSize;
  int vSize;
  bool hasNormal;
  Face *local_38;
  Face *face;
  char *local_28;
  char *local_20;
  aiPrimitiveType local_14;
  ObjFileParser *pOStack_10;
  aiPrimitiveType type_local;
  ObjFileParser *this_local;
  
  local_28 = (this->m_DataIt)._M_current;
  face = (Face *)(this->m_DataItEnd)._M_current;
  local_14 = type;
  pOStack_10 = this;
  local_20 = (char *)getNextToken<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                               ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )local_28,
                                (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                 )face);
  (this->m_DataIt)._M_current = local_20;
  bVar1 = __gnu_cxx::operator==(&this->m_DataIt,&this->m_DataItEnd);
  if ((!bVar1) &&
     (pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt), *pcVar2 != '\0')) {
    pFVar3 = (Face *)operator_new(0x58);
    ObjFile::Face::Face(pFVar3,local_14);
    vtSize._3_1_ = 0;
    local_38 = pFVar3;
    pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    sVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (&pMVar4->m_Vertices);
    vnSize = (int)sVar5;
    pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    sVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (&pMVar4->m_TextureCoord);
    iStack_50 = (int)sVar5;
    pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    sVar5 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                      (&pMVar4->m_Normals);
    iStep = (int)sVar5;
    pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    bVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                      (&pMVar4->m_TextureCoord);
    iPos._3_1_ = (bVar1 ^ 0xffU) & 1;
    pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
             operator->(&this->m_pModel);
    bVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::empty
                      (&pMVar4->m_Normals);
    iPos._2_1_ = (bVar1 ^ 0xffU) & 1;
    iVal = 0;
    tmp = 0;
    while (bVar1 = __gnu_cxx::operator!=(&this->m_DataIt,&this->m_DataItEnd), bVar1) {
      iVal = 1;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      bVar1 = IsLineEnd<char>(*pcVar2);
      if (bVar1) break;
      pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
               operator*(&this->m_DataIt);
      if (*pcVar2 == '/') {
        if (local_14 == aiPrimitiveType_POINT) {
          pLVar6 = DefaultLogger::get();
          Logger::error(pLVar6,"Obj: Separator unexpected in point statement");
        }
        tmp = tmp + 1;
      }
      else {
        pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                 operator*(&this->m_DataIt);
        bVar1 = IsSpaceOrNewLine<char>(*pcVar2);
        if (bVar1) {
          tmp = 0;
        }
        else {
          pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                   operator*(&this->m_DataIt);
          local_64 = atoi(pcVar2);
          pFVar3 = local_38;
          local_68 = local_64;
          if (local_64 < 0) {
            iVal = iVal + 1;
          }
          while (local_68 = local_68 / 10, local_68 != 0) {
            iVal = iVal + 1;
          }
          if (((tmp == 1) && ((iPos._3_1_ & 1) == 0)) && ((iPos._2_1_ & 1) != 0)) {
            tmp = 2;
          }
          if (local_64 < 1) {
            if (-1 < local_64) {
              if (local_38 != (Face *)0x0) {
                ObjFile::Face::~Face(local_38);
                operator_delete(pFVar3);
              }
              this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_a0,"OBJ: Invalid face indice",&local_a1)
              ;
              DeadlyImportError::DeadlyImportError(this_00,&local_a0);
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError
                         );
            }
            if (tmp == 0) {
              local_78 = vnSize + local_64;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&local_38->m_vertices,&local_78);
            }
            else if (tmp == 1) {
              local_7c = iStack_50 + local_64;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&local_38->m_texturCoords,&local_7c);
            }
            else if (tmp == 2) {
              local_80 = iStep + local_64;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&local_38->m_normals,&local_80);
              vtSize._3_1_ = 1;
            }
            else {
              reportErrorTokenInFace(this);
            }
          }
          else if (tmp == 0) {
            local_6c = local_64 - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&local_38->m_vertices,&local_6c);
          }
          else if (tmp == 1) {
            local_70 = local_64 - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&local_38->m_texturCoords,&local_70);
          }
          else if (tmp == 2) {
            local_74 = local_64 - 1;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (&local_38->m_normals,&local_74);
            vtSize._3_1_ = 1;
          }
          else {
            reportErrorTokenInFace(this);
          }
        }
      }
      __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+=
                (&this->m_DataIt,(long)iVal);
    }
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty(&local_38->m_vertices);
    if (bVar1) {
      pLVar6 = DefaultLogger::get();
      Logger::error(pLVar6,"Obj: Ignoring empty face");
      _Var7 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine)
      ;
      pFVar3 = local_38;
      (this->m_DataIt)._M_current = _Var7._M_current;
      if (local_38 != (Face *)0x0) {
        ObjFile::Face::~Face(local_38);
        operator_delete(pFVar3);
      }
    }
    else {
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      if (pMVar4->m_pCurrentMaterial == (Material *)0x0) {
        pMVar4 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        local_38->m_pMaterial = pMVar4->m_pDefaultMaterial;
      }
      else {
        pMVar4 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        local_38->m_pMaterial = pMVar4->m_pCurrentMaterial;
      }
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      if (pMVar4->m_pCurrent == (Object *)0x0) {
        createObject(this,(string *)DefaultObjName_abi_cxx11_);
      }
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      if (pMVar4->m_pCurrentMesh == (Mesh *)0x0) {
        createMesh(this,(string *)DefaultObjName_abi_cxx11_);
      }
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      std::vector<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>::push_back
                (&pMVar4->m_pCurrentMesh->m_Faces,&local_38);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_38->m_vertices);
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar4->m_pCurrentMesh->m_uiNumIndices = (int)sVar5 + pMVar4->m_pCurrentMesh->m_uiNumIndices;
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (&local_38->m_texturCoords);
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      pMVar4->m_pCurrentMesh->m_uiUVCoordinates[0] =
           (int)sVar5 + pMVar4->m_pCurrentMesh->m_uiUVCoordinates[0];
      pMVar4 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      if (((pMVar4->m_pCurrentMesh->m_hasNormals & 1U) == 0) && ((vtSize._3_1_ & 1) != 0)) {
        pMVar4 = std::
                 unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>::
                 operator->(&this->m_pModel);
        pMVar4->m_pCurrentMesh->m_hasNormals = true;
      }
      _Var7 = skipLine<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                        ((this->m_DataIt)._M_current,(this->m_DataItEnd)._M_current,&this->m_uiLine)
      ;
      (this->m_DataIt)._M_current = _Var7._M_current;
    }
  }
  return;
}

Assistant:

void ObjFileParser::getFace( aiPrimitiveType type ) {
    m_DataIt = getNextToken<DataArrayIt>( m_DataIt, m_DataItEnd );
    if ( m_DataIt == m_DataItEnd || *m_DataIt == '\0' ) {
        return;
    }

    ObjFile::Face *face = new ObjFile::Face( type );
    bool hasNormal = false;

    const int vSize = static_cast<unsigned int>(m_pModel->m_Vertices.size());
    const int vtSize = static_cast<unsigned int>(m_pModel->m_TextureCoord.size());
    const int vnSize = static_cast<unsigned int>(m_pModel->m_Normals.size());

    const bool vt = (!m_pModel->m_TextureCoord.empty());
    const bool vn = (!m_pModel->m_Normals.empty());
    int iStep = 0, iPos = 0;
    while ( m_DataIt != m_DataItEnd ) {
        iStep = 1;

        if ( IsLineEnd( *m_DataIt ) ) {
            break;
        }

        if ( *m_DataIt =='/' ) {
            if (type == aiPrimitiveType_POINT) {
                ASSIMP_LOG_ERROR("Obj: Separator unexpected in point statement");
            }
            iPos++;
        } else if( IsSpaceOrNewLine( *m_DataIt ) ) {
            iPos = 0;
        } else {
            //OBJ USES 1 Base ARRAYS!!!!
            const int iVal( ::atoi( & ( *m_DataIt ) ) );

            // increment iStep position based off of the sign and # of digits
            int tmp = iVal;
            if ( iVal < 0 ) {
                ++iStep;
            }
            while ( ( tmp = tmp / 10 ) != 0 ) {
                ++iStep;
            }

            if (iPos == 1 && !vt && vn)
                iPos = 2; // skip texture coords for normals if there are no tex coords

            if ( iVal > 0 ) {
                // Store parsed index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( iVal - 1 );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( iVal - 1 );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( iVal - 1 );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else if ( iVal < 0 ) {
                // Store relatively index
                if ( 0 == iPos ) {
                    face->m_vertices.push_back( vSize + iVal );
                } else if ( 1 == iPos ) {
                    face->m_texturCoords.push_back( vtSize + iVal );
                } else if ( 2 == iPos ) {
                    face->m_normals.push_back( vnSize + iVal );
                    hasNormal = true;
                } else {
                    reportErrorTokenInFace();
                }
            } else {
                //On error, std::atoi will return 0 which is not a valid value
                delete face;
                throw DeadlyImportError("OBJ: Invalid face indice");
            }

        }
        m_DataIt += iStep;
    }

    if ( face->m_vertices.empty() ) {
        ASSIMP_LOG_ERROR("Obj: Ignoring empty face");
        // skip line and clean up
        m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
        delete face;
        return;
    }

    // Set active material, if one set
    if( NULL != m_pModel->m_pCurrentMaterial ) {
        face->m_pMaterial = m_pModel->m_pCurrentMaterial;
    } else {
        face->m_pMaterial = m_pModel->m_pDefaultMaterial;
    }

    // Create a default object, if nothing is there
    if( NULL == m_pModel->m_pCurrent ) {
        createObject( DefaultObjName );
    }

    // Assign face to mesh
    if ( NULL == m_pModel->m_pCurrentMesh ) {
        createMesh( DefaultObjName );
    }

    // Store the face
    m_pModel->m_pCurrentMesh->m_Faces.push_back( face );
    m_pModel->m_pCurrentMesh->m_uiNumIndices += (unsigned int) face->m_vertices.size();
    m_pModel->m_pCurrentMesh->m_uiUVCoordinates[ 0 ] += (unsigned int) face->m_texturCoords.size();
    if( !m_pModel->m_pCurrentMesh->m_hasNormals && hasNormal ) {
        m_pModel->m_pCurrentMesh->m_hasNormals = true;
    }
    // Skip the rest of the line
    m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
}